

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_lwm_mips64el(CPUMIPSState_conflict5 *env,target_ulong addr,target_ulong reglist,
                        uint32_t mem_idx)

{
  uint32_t uVar1;
  ulong uVar2;
  uintptr_t unaff_retaddr;
  ulong local_40;
  target_ulong i;
  target_ulong do_r31;
  target_ulong base_reglist;
  uint32_t mem_idx_local;
  target_ulong reglist_local;
  target_ulong addr_local;
  CPUMIPSState_conflict5 *env_local;
  
  uVar2 = reglist & 0xf;
  reglist_local = addr;
  if ((uVar2 != 0) && (uVar2 < 10)) {
    for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
      uVar1 = cpu_ldl_mmuidx_ra_mips64el
                        ((CPUArchState_conflict13 *)env,reglist_local,mem_idx,unaff_retaddr);
      (env->active_tc).gpr[multiple_regs[local_40]] = (ulong)uVar1;
      reglist_local = reglist_local + 4;
    }
  }
  if ((reglist & 0x10) != 0) {
    uVar1 = cpu_ldl_mmuidx_ra_mips64el
                      ((CPUArchState_conflict13 *)env,reglist_local,mem_idx,unaff_retaddr);
    (env->active_tc).gpr[0x1f] = (ulong)uVar1;
  }
  return;
}

Assistant:

void helper_lwm(CPUMIPSState *env, target_ulong addr, target_ulong reglist,
                uint32_t mem_idx)
{
    target_ulong base_reglist = reglist & 0xf;
    target_ulong do_r31 = reglist & 0x10;

    if (base_reglist > 0 && base_reglist <= ARRAY_SIZE(multiple_regs)) {
        target_ulong i;

        for (i = 0; i < base_reglist; i++) {
            env->active_tc.gpr[multiple_regs[i]] =
                (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
            addr += 4;
        }
    }

    if (do_r31) {
        env->active_tc.gpr[31] =
            (target_long)cpu_ldl_mmuidx_ra(env, addr, mem_idx, GETPC());
    }
}